

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetWindows.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* (anonymous_namespace)::TextPropertyToStrings_abi_cxx11_(Display *dpy,XTextProperty *prop)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  int i;
  int status;
  int n_strings;
  char **list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  int iVar2;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_24;
  long *local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_24 = 0;
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x14cfbf);
  iVar1 = XmbTextPropertyToTextList(local_10,local_18,&local_20,&local_24);
  if (((-1 < iVar1) && (local_24 != 0)) && (*local_20 != 0)) {
    for (iVar2 = 0; iVar2 < local_24; iVar2 = iVar2 + 1) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char*&>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (char **)CONCAT44(iVar2,iVar1));
    }
    XFreeStringList(local_20);
  }
  return in_RDI;
}

Assistant:

auto TextPropertyToStrings(
        Display* dpy,
        const XTextProperty& prop
    )
    {
        char **list;
        auto n_strings = 0;
        auto result = std::vector<std::string>{};

        auto status = XmbTextPropertyToTextList(
            dpy,
            &prop,
            &list,
            &n_strings
        );

        if (status < Success or not n_strings or not *list) {
            return result;
        }

        for (auto i = 0; i < n_strings; ++i) {
            result.emplace_back(list[i]);
        }

        XFreeStringList(list);

        return result;
    }